

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O0

void __thiscall
ImageInverter::registerImage
          (ImageInverter *this,QPDFObjectHandle *image,
          shared_ptr<QPDFObjectHandle::StreamDataProvider> *self)

{
  size_type sVar1;
  mapped_type *this_00;
  QPDFObjectHandle local_78;
  QPDFObjectHandle local_68;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_58 [2];
  QPDFObjectHandle local_38;
  QPDFObjGen local_28;
  QPDFObjGen og;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> *self_local;
  QPDFObjectHandle *image_local;
  ImageInverter *this_local;
  
  og = (QPDFObjGen)self;
  local_28 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&image->super_BaseHandle);
  sVar1 = std::
          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          ::count(&this->copied_images,&local_28);
  if (sVar1 == 0) {
    QPDFObjectHandle::copyStream();
    this_00 = std::
              map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
              ::operator[](&this->copied_images,&local_28);
    QPDFObjectHandle::operator=(this_00,&local_38);
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr(local_58,self);
    QPDFObjectHandle::newNull();
    QPDFObjectHandle::newNull();
    QPDFObjectHandle::replaceStreamData(image,local_58,&local_68,&local_78);
    QPDFObjectHandle::~QPDFObjectHandle(&local_78);
    QPDFObjectHandle::~QPDFObjectHandle(&local_68);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(local_58);
  }
  return;
}

Assistant:

void
ImageInverter::registerImage(
    QPDFObjectHandle image, std::shared_ptr<QPDFObjectHandle::StreamDataProvider> self)
{
    // replaceStreamData requires a pointer holder to the stream data provider, but there's no way
    // for us to generate one ourselves, so we have to have it handed to us. Don't be tempted to
    // have the class contain a std::shared_ptr to itself as a member. Doing this will prevent the
    // class from ever being deleted since the reference count will never drop to zero (and
    // std::shared_ptr doesn't have weak references).

    QPDFObjGen og(image);
    // Store information about the images based on the object and generation number. Recall that a
    // single image object may be used more than once, so no need to update the same stream multiple
    // times.
    if (this->copied_images.count(og) > 0) {
        return;
    }
    this->copied_images[og] = image.copyStream();

    // Register our stream data provider for this stream. Future calls to getStreamData or
    // pipeStreamData will use the new information. Provide null for both filter and decode
    // parameters. Note that this does not mean the image data will be uncompressed when we write
    // the file. By default, QPDFWriter will use /FlateDecode for anything that is uncompressed or
    // filterable in the input QPDF object, so we don't have to deal with it explicitly here. We
    // could explicitly use /DCTDecode and write through a DCT filter if we wanted.
    image.replaceStreamData(self, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
}